

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void idx2::IncreaseCapacity<short,idx2::bitstream>(hash_table<short,_idx2::bitstream> *Ht)

{
  long lVar1;
  long lVar2;
  bitstream *Key;
  hash_table<short,_idx2::bitstream> *Ht_00;
  long lVar3;
  bitstream *in_R8;
  long lVar4;
  hash_table<short,_idx2::bitstream> NewHt;
  hash_table<short,_idx2::bitstream> hStack_78;
  iterator local_40;
  
  hStack_78.Keys = (short *)0x0;
  hStack_78.LogCapacity = 0;
  hStack_78.Alloc = (allocator *)0x0;
  hStack_78.Vals = (bitstream *)0x0;
  hStack_78.Stats = (bucket_status *)0x0;
  hStack_78.Size = 0;
  Init<short,idx2::bitstream>(&hStack_78,Ht->LogCapacity + 1,Ht->Alloc);
  lVar2 = 1L << ((byte)Ht->LogCapacity & 0x3f);
  if (Ht->LogCapacity == 0x3f) {
    lVar4 = -0x8000000000000000;
LAB_001869b7:
    if (lVar4 != lVar2) {
      Key = Ht->Vals + lVar4;
      Ht_00 = (hash_table<short,_idx2::bitstream> *)(Ht->Keys + lVar4);
      do {
        Insert<short,idx2::bitstream>(&local_40,(idx2 *)&hStack_78,Ht_00,(short *)Key,in_R8);
        lVar2 = lVar4 * -0x30;
        lVar3 = lVar4 * -2;
        do {
          lVar2 = lVar2 + -0x30;
          lVar3 = lVar3 + -2;
          lVar1 = lVar4 + 1;
          lVar4 = lVar4 + 1;
        } while (Ht->Stats[lVar1] != Occupied);
        Ht_00 = (hash_table<short,_idx2::bitstream> *)((long)Ht->Keys - lVar3);
        Key = (bitstream *)((long)Ht->Vals - lVar2);
      } while (1L << ((byte)Ht->LogCapacity & 0x3f) != lVar4);
    }
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    if (0 < lVar2) {
      lVar3 = lVar2;
    }
    do {
      if (Ht->Stats[lVar4] == Occupied) goto LAB_001869b7;
      lVar4 = lVar4 + 1;
    } while (lVar3 + 1 != lVar4);
  }
  Dealloc<short,idx2::bitstream>(Ht);
  Ht->Stats = hStack_78.Stats;
  Ht->Size = hStack_78.Size;
  Ht->LogCapacity = hStack_78.LogCapacity;
  Ht->Alloc = hStack_78.Alloc;
  Ht->Keys = hStack_78.Keys;
  Ht->Vals = hStack_78.Vals;
  Ht->Stats = hStack_78.Stats;
  Ht->Size = hStack_78.Size;
  return;
}

Assistant:

void
IncreaseCapacity(hash_table<k, v>* Ht)
{
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
    Insert(&NewHt, *(It.Key), *(It.Val));
  Dealloc(Ht);
  *Ht = NewHt;
}